

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

void __thiscall
helics::InterfaceInfo::createEndpoint
          (InterfaceInfo *this,InterfaceHandle handle,string_view endpointName,string_view type,
          uint16_t flags)

{
  bool bVar1;
  GlobalFederateId fed;
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *data_1;
  EndpointInfo *pEVar2;
  BaseType in_ESI;
  uint16_t in_stack_00000008;
  handle ceHandle;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *this_00;
  GlobalHandle *data;
  InterfaceHandle *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  undefined4 in_stack_ffffffffffffff70;
  GlobalHandle local_84 [3];
  GlobalHandle local_69 [4];
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  local_48 [2];
  InterfaceHandle local_4;
  
  this_00 = local_48;
  local_4.hid = in_ESI;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(in_stack_fffffffffffffed8);
  data_1 = gmlc::libguarded::
           lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
           ::operator->(this_00);
  data = local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
             ,(allocator<char> *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  fed = std::atomic::operator_cast_to_GlobalFederateId
                  ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffed8);
  GlobalHandle::GlobalHandle(local_84,fed,local_4);
  gmlc::containers::
  DualMappedPointerVector<helics::EndpointInfo,std::__cxx11::string,helics::InterfaceHandle>::
  insert<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
              *)CONCAT44(local_4.hid,in_stack_ffffffffffffff70),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60
             ,data,(basic_string_view<char,_std::char_traits<char>_> *)data_1,
             (basic_string_view<char,_std::char_traits<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000008,required_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    pEVar2 = gmlc::containers::
             DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             ::back((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                     *)0x5b009c);
    EndpointInfo::setProperty(pEVar2,0x18d,1);
  }
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000008,optional_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    pEVar2 = gmlc::containers::
             DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             ::back((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                     *)0x5b0154);
    EndpointInfo::setProperty(pEVar2,0x192,1);
  }
  bVar1 = checkActionFlag<helics::EndpointFlags>(in_stack_00000008,targeted_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    pEVar2 = gmlc::containers::
             DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             ::back((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                     *)0x5b01aa);
    pEVar2->targetedEndpoint = true;
  }
  bVar1 = checkActionFlag<helics::InterfaceFlags>(in_stack_00000008,single_connection_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    pEVar2 = gmlc::containers::
             DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             ::back((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                     *)0x5b01f4);
    EndpointInfo::setProperty(pEVar2,0x197,1);
  }
  bVar1 = checkActionFlag<helics::EndpointFlags>(in_stack_00000008,source_only_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    pEVar2 = gmlc::containers::
             DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             ::back((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                     *)0x5b024a);
    EndpointInfo::setProperty(pEVar2,0x1a7,1);
  }
  bVar1 = checkActionFlag<helics::EndpointFlags>(in_stack_00000008,receive_only_flag);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::operator->(local_48);
    pEVar2 = gmlc::containers::
             DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
             ::back((DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
                     *)0x5b02a0);
    EndpointInfo::setProperty(pEVar2,0x1a6,1);
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5b02ca);
  return;
}

Assistant:

void InterfaceInfo::createEndpoint(InterfaceHandle handle,
                                   std::string_view endpointName,
                                   std::string_view type,
                                   std::uint16_t flags)
{
    auto ceHandle = endpoints.lock();
    ceHandle->insert(
        std::string(endpointName), handle, GlobalHandle{global_id, handle}, endpointName, type);
    if (checkActionFlag(flags, required_flag)) {
        ceHandle->back()->setProperty(defs::Options::CONNECTION_REQUIRED, 1);
    }
    if (checkActionFlag(flags, optional_flag)) {
        ceHandle->back()->setProperty(defs::Options::CONNECTION_OPTIONAL, 1);
    }
    if (checkActionFlag(flags, targeted_flag)) {
        ceHandle->back()->targetedEndpoint = true;
    }
    if (checkActionFlag(flags, single_connection_flag)) {
        ceHandle->back()->setProperty(defs::Options::SINGLE_CONNECTION_ONLY, 1);
    }
    if (checkActionFlag(flags, source_only_flag)) {
        ceHandle->back()->setProperty(defs::Options::SEND_ONLY, 1);
    }
    if (checkActionFlag(flags, receive_only_flag)) {
        ceHandle->back()->setProperty(defs::Options::RECEIVE_ONLY, 1);
    }
}